

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-uri.cpp
# Opt level: O2

ostream * nlohmann::operator<<(ostream *os,json_uri *u)

{
  ostream *poVar1;
  string local_30;
  
  json_uri::to_string_abi_cxx11_(&local_30,u);
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const json_uri &u)
{
	return os << u.to_string();
}